

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O0

float __thiscall benchmark_4::run_kernel(benchmark_4 *this,size_t iterations)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  long in_RSI;
  long in_RDI;
  uint uVar10;
  float fVar11;
  undefined1 in_ZMM0 [64];
  __m256 r3;
  __m256 r2;
  __m256 r1;
  __m256 r0;
  undefined8 local_420;
  undefined8 uStackY_418;
  undefined8 uStackY_410;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined8 local_3a0;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  
  uVar1 = rdtsc();
  uVar7 = (uint)((ulong)uVar1 >> 0x20);
  uVar6 = CONCAT44((int)((ulong)in_RDI >> 0x20),(int)uVar1) | (ulong)uVar7 << 0x20;
  auVar3 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,uVar6);
  uVar10 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar10),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar10),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(uVar10),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar10),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar10),0x30);
  local_3c0._16_16_ = auVar2;
  local_3c0._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar8 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar6 = CONCAT44((int)(uVar6 >> 0x20),(int)uVar1) | CONCAT44(uVar7,uVar8) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar6);
  uVar7 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x30);
  local_3e0._16_16_ = auVar2;
  local_3e0._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar9 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar6 = CONCAT44((int)(uVar6 >> 0x20),(int)uVar1) | CONCAT44(uVar8,uVar9) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar6);
  uVar7 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x30);
  uVar12 = auVar3._0_8_;
  uVar13 = auVar3._8_8_;
  uVar14 = auVar2._0_8_;
  uStack_3e8 = auVar2._8_8_;
  uVar1 = rdtsc();
  auVar3 = vcvtusi2ss_avx512f(auVar3,CONCAT44((int)(uVar6 >> 0x20),(int)uVar1) |
                                     CONCAT44(uVar9,(int)((ulong)uVar1 >> 0x20)) << 0x20);
  uVar7 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar7),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar7),ZEXT416(uVar7),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar7),0x30);
  local_2c0 = auVar2._0_8_;
  uStack_2b8 = auVar2._8_8_;
  uStack_2b0 = auVar3._0_8_;
  uStack_2a8 = auVar3._8_8_;
  local_420 = local_2c0;
  uStackY_418 = uStack_2b8;
  uStackY_410 = uStack_2b0;
  local_3a0 = in_RSI;
  do {
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_3c0);
    local_3c0 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_3e0);
    local_3e0 = ZEXT1632(auVar3);
    auVar5._8_8_ = uVar13;
    auVar5._0_8_ = uVar12;
    auVar5._16_8_ = uVar14;
    auVar5._24_8_ = uStack_3e8;
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),auVar5);
    uVar12 = auVar3._0_8_;
    uVar13 = auVar3._8_8_;
    uVar14 = 0;
    uStack_3e8 = 0;
    auVar4._8_8_ = uStackY_418;
    auVar4._0_8_ = local_420;
    auVar4._16_8_ = uStackY_410;
    auVar4._24_8_ = uStack_2a8;
    auVar2 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),auVar4);
    local_420 = auVar2._0_8_;
    uStackY_418 = auVar2._8_8_;
    uStackY_410 = 0;
    uStack_2a8 = 0;
    local_3a0 = local_3a0 + -1;
  } while (local_3a0 != 0);
  fVar11 = __m256_reduce_add_ps((__m256)(ZEXT1632(auVar3) << 0x40));
  return fVar11;
}

Assistant:

float run_kernel(size_t iterations) const override
    {
            __m256 r0 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r1 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r2 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r3 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            do{
                r0 = _mm256_fmadd_ps(mul0, mul1, r0);
                r1 = _mm256_fmadd_ps(mul0, mul1, r1);
                r2 = _mm256_fmadd_ps(mul0, mul1, r2);
                r3 = _mm256_fmadd_ps(mul0, mul1, r3);

            }while (--iterations);

            r0 = _mm256_add_ps(r0, r2);
            r1 = _mm256_add_ps(r1, r3);

            r0 = _mm256_add_ps(r0, r1);
            return __m256_reduce_add_ps(r0);
    }